

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O0

char * ON_ParseUuidString(char *sUUID,ON_UUID *uuid)

{
  byte bVar1;
  int iVar2;
  endian eVar3;
  bool bVar4;
  ON_UUID *local_60;
  int *local_58;
  char local_47 [3];
  int local_44;
  uchar byte_value [2];
  int iStack_40;
  uchar c;
  int ci;
  int bi;
  unsigned_short uStack_34;
  unsigned_short uStack_32;
  bool bFailed;
  anon_union_16_2_c96208d8 u;
  ON_UUID *local_18;
  ON_UUID *uuid_local;
  char *sUUID_local;
  
  local_18 = uuid;
  uuid_local = (ON_UUID *)sUUID;
  if ((ON_ParseUuidString(char_const*,ON_UUID_struct*)::rho == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ON_ParseUuidString(char_const*,ON_UUID_struct*)::rho), iVar2 != 0
     )) {
    eVar3 = ON::Endian();
    if (eVar3 == big_endian) {
      local_58 = big_endian_rho;
    }
    else {
      local_58 = little_endian_rho;
    }
    ON_ParseUuidString::rho = local_58;
    __cxa_guard_release(&ON_ParseUuidString(char_const*,ON_UUID_struct*)::rho);
  }
  bi = 0;
  uStack_34 = 0;
  uStack_32 = 0;
  u._0_8_ = 0;
  bVar4 = uuid_local == (ON_UUID *)0x0;
  if (!bVar4) {
    for (iStack_40 = 0; iStack_40 < 0x10; iStack_40 = iStack_40 + 1) {
      local_44 = 0;
      local_47[0] = '\0';
      local_47[1] = '\0';
      while (local_44 < 2) {
        bVar1 = (byte)uuid_local->Data1;
        if (bVar1 == 0) {
          bVar4 = true;
          break;
        }
        if ((bVar1 < 0x41) || (0x46 < bVar1)) {
          if ((bVar1 < 0x30) || (0x39 < bVar1)) {
            if ((bVar1 < 0x61) || (0x66 < bVar1)) {
              if (bVar1 != 0x2d) {
                bVar4 = true;
                break;
              }
            }
            else {
              local_47[local_44] = bVar1 + 0xa9;
              local_44 = local_44 + 1;
            }
          }
          else {
            local_47[local_44] = bVar1 - 0x30;
            local_44 = local_44 + 1;
          }
        }
        else {
          local_47[local_44] = bVar1 - 0x37;
          local_44 = local_44 + 1;
        }
        uuid_local = (ON_UUID *)((long)&uuid_local->Data1 + 1);
      }
      if (bVar4) break;
      *(char *)((long)&bi + (long)ON_ParseUuidString::rho[iStack_40]) =
           local_47[0] * '\x10' + local_47[1];
    }
  }
  if (bVar4) {
    bi = 0;
    uStack_34 = 0;
    uStack_32 = 0;
    u._0_1_ = '\0';
    u._1_1_ = '\0';
    u._2_1_ = '\0';
    u._3_1_ = '\0';
    u._4_1_ = '\0';
    u._5_1_ = '\0';
    u._6_1_ = '\0';
    u._7_1_ = '\0';
  }
  if (local_18 != (ON_UUID *)0x0) {
    local_18->Data1 = bi;
    local_18->Data2 = uStack_34;
    local_18->Data3 = uStack_32;
    *(undefined8 *)local_18->Data4 = u._0_8_;
  }
  if (bVar4) {
    local_60 = (ON_UUID *)0x0;
  }
  else {
    local_60 = uuid_local;
  }
  return (char *)local_60;
}

Assistant:

const char* ON_ParseUuidString(const char* sUUID, ON_UUID* uuid)
{
  // NOTE WELL: This code has to work on non-Windows OSs and on
  //            both big and little endian CPUs.  On Windows OSs
  //            is must return the same result as 
  //            Windows's UuidFromString().
  //

  // string has format like "85A08515-F383-11d3-BFE7-0010830122F0"
  // or like "85A08515-F383-11d3-BFE7-0010830122F0".
  // Hyphens are optional and ignored.
  //
  // Windows users can use "guidgen" to create UUID strings.

  /*
  #if defined(ON_DEBUG) && defined(ON_RUNTIME_WIN)
  RPC_STATUS st;
  union
  {
  ON_UUID uuid;
  unsigned char b[16];
  } u1;
  st = UuidFromString( (unsigned char*)sUUID, &u1.uuid );
  #endif
  */

  static const int* rho = (ON::endian::big_endian == ON::Endian())
    ? big_endian_rho
    : little_endian_rho;

  union
  {
    ON_UUID uuid;
    unsigned char b[16];
  } u;
  bool bFailed;
  int bi, ci;
  unsigned char c;
  unsigned char byte_value[2];

  memset(&u, 0, sizeof(u));
  //for ( bi = 0; bi < 16; bi++ ) 
  //  u.b[bi] = 0;

  bFailed = sUUID ? false : true;

  if (!bFailed)
  {
    for (bi = 0; bi < 16; bi++)
    {
      ci = 0;
      byte_value[0] = 0;
      byte_value[1] = 0;
      while (ci < 2)
      {
        c = *sUUID;
        if (!c) {
          bFailed = true;
          break;
        }
        if (c >= 'A' && c <= 'F') {
          byte_value[ci++] = (c - 'A' + 10);
        }
        else if (c >= '0' && c <= '9') {
          byte_value[ci++] = (c - '0');
        }
        else if (c >= 'a' && c <= 'f') {
          byte_value[ci++] = (c - 'a' + 10);
        }
        else if (c != '-') {
          bFailed = true;
          break;
        }
        sUUID++;
      }
      if (bFailed)
        break;
      u.b[rho[bi]] = 16 * byte_value[0] + byte_value[1];
    }
  }

  if (bFailed) 
  {
    // 09 August 2006 John Morse
    // There are times when Rhino is looking for a plug-in but the SDK or command
    // allows the plug-in to be specified by name or UUID.  Rhino calls ON_UuidFromString()
    // to see if the string is a plug-in UUID so it knows if it should be comparing the string
    // or plug-in name when looking for a plug-in.  The ON_ERROR line makes the Rhino commands
    // generate an OpenNURBS message box (in DEBUG builds) when the command completes and is
    // a pain so I commented it out per Dale Lear.
    //ON_ERROR("ON_UuidFromString(): bad string passed in");
    u.uuid = ON_nil_uuid;
  }

  if (uuid)
    *uuid = u.uuid;

  return bFailed ? 0 : sUUID;
}